

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

void mtbdd_unmark_rec(MTBDD mtbdd)

{
  uint8_t *puVar1;
  ulong uVar2;
  long lVar3;
  
  while( true ) {
    lVar3 = (mtbdd & 0xffffffffff) * 0x10;
    puVar1 = nodes->data;
    uVar2 = *(ulong *)(puVar1 + lVar3);
    if (((uVar2 >> 0x3d & 1) == 0) ||
       (*(ulong *)(puVar1 + lVar3) = uVar2 & 0xdfffffffffffffff, (uVar2 >> 0x3e & 1) != 0)) break;
    mtbdd_unmark_rec(*(ulong *)(puVar1 + lVar3 + 8) & 0xffffffffff);
    mtbdd = *(MTBDD *)(puVar1 + lVar3);
  }
  return;
}

Assistant:

static void
mtbdd_unmark_rec(MTBDD mtbdd)
{
    mtbddnode_t n = MTBDD_GETNODE(mtbdd);
    if (!mtbddnode_getmark(n)) return;
    mtbddnode_setmark(n, 0);
    if (mtbddnode_isleaf(n)) return;
    mtbdd_unmark_rec(mtbddnode_getlow(n));
    mtbdd_unmark_rec(mtbddnode_gethigh(n));
}